

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

type __thiscall
itlib::
flat_map<std::__cxx11::string,Rml::PseudoClassState,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::PseudoClassState>,std::allocator<std::pair<std::__cxx11::string,Rml::PseudoClassState>>>>
::operator[]<std::__cxx11::string_const&>
          (flat_map<std::__cxx11::string,Rml::PseudoClassState,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::PseudoClassState>,std::allocator<std::pair<std::__cxx11::string,Rml::PseudoClassState>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  iterator __position;
  PseudoClassState local_19;
  
  __position = lower_bound<std::__cxx11::string>(this,k);
  if (__position._M_current !=
      *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>
        **)(this + 8)) {
    bVar1 = std::operator<(k,&(__position._M_current)->first);
    if (!bVar1) goto LAB_0029594d;
  }
  local_19 = Clear;
  __position._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>
        *)std::
          vector<std::pair<std::__cxx11::string,Rml::PseudoClassState>,std::allocator<std::pair<std::__cxx11::string,Rml::PseudoClassState>>>
          ::_M_emplace_aux<std::__cxx11::string_const&,Rml::PseudoClassState>
                    ((vector<std::pair<std::__cxx11::string,Rml::PseudoClassState>,std::allocator<std::pair<std::__cxx11::string,Rml::PseudoClassState>>>
                      *)this,__position._M_current,k,&local_19);
LAB_0029594d:
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }